

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList>::
emplaceRealloc<slang::syntax::TransRangeSyntax&,slang::ast::Type_const&,slang::ast::ASTContext&>
          (SmallVectorBase<slang::ast::CoverageBinSymbol::TransRangeList> *this,pointer pos,
          TransRangeSyntax *args,Type *args_1,ASTContext *args_2)

{
  TransRangeList *this_00;
  ulong uVar1;
  pointer p;
  pointer ppEVar2;
  size_t sVar3;
  Expression *pEVar4;
  undefined4 uVar5;
  pointer pTVar6;
  long lVar7;
  pointer pTVar8;
  pointer pTVar9;
  long lVar10;
  size_type sVar11;
  ulong uVar12;
  
  if (this->len == 0x333333333333333) {
    detail::throwLengthError();
  }
  uVar12 = this->len + 1;
  uVar1 = this->cap;
  if (uVar12 < uVar1 * 2) {
    uVar12 = uVar1 * 2;
  }
  if (0x333333333333333 - uVar1 < uVar1) {
    uVar12 = 0x333333333333333;
  }
  lVar10 = (long)pos - (long)this->data_;
  pTVar6 = (pointer)operator_new(uVar12 * 0x28);
  this_00 = (TransRangeList *)((long)pTVar6 + lVar10);
  ast::CoverageBinSymbol::TransRangeList::TransRangeList(this_00,args,args_1,args_2);
  p = this->data_;
  sVar11 = this->len;
  lVar7 = (long)p + (sVar11 * 0x28 - (long)pos);
  pTVar8 = p;
  pTVar9 = pTVar6;
  if (lVar7 == 0) {
    pTVar8 = pTVar6;
    pTVar9 = p;
    if (sVar11 != 0) {
      do {
        uVar5 = *(undefined4 *)&pTVar9->field_0x24;
        pTVar8->repeatKind = pTVar9->repeatKind;
        *(undefined4 *)&pTVar8->field_0x24 = uVar5;
        ppEVar2 = (pTVar9->items)._M_ptr;
        sVar3 = (pTVar9->items)._M_extent._M_extent_value;
        pEVar4 = pTVar9->repeatTo;
        pTVar8->repeatFrom = pTVar9->repeatFrom;
        pTVar8->repeatTo = pEVar4;
        (pTVar8->items)._M_ptr = ppEVar2;
        (pTVar8->items)._M_extent._M_extent_value = sVar3;
        pTVar9 = pTVar9 + 1;
        pTVar8 = pTVar8 + 1;
      } while (pTVar9 != pos);
    }
  }
  else {
    for (; pTVar8 != pos; pTVar8 = pTVar8 + 1) {
      uVar5 = *(undefined4 *)&pTVar8->field_0x24;
      pTVar9->repeatKind = pTVar8->repeatKind;
      *(undefined4 *)&pTVar9->field_0x24 = uVar5;
      ppEVar2 = (pTVar8->items)._M_ptr;
      sVar3 = (pTVar8->items)._M_extent._M_extent_value;
      pEVar4 = pTVar8->repeatTo;
      pTVar9->repeatFrom = pTVar8->repeatFrom;
      pTVar9->repeatTo = pEVar4;
      (pTVar9->items)._M_ptr = ppEVar2;
      (pTVar9->items)._M_extent._M_extent_value = sVar3;
      pTVar9 = pTVar9 + 1;
    }
    memcpy((void *)((long)pTVar6 + lVar10 + 0x28),pos,((lVar7 - 0x28U) / 0x28) * 0x28 + 0x28);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
    sVar11 = this->len;
  }
  this->len = sVar11 + 1;
  this->cap = uVar12;
  this->data_ = pTVar6;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}